

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  undefined8 uVar9;
  byte bVar10;
  int iVar11;
  pointer pcVar12;
  ostream *this;
  base_learner *base_00;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *this_00;
  id in_RSI;
  long *in_RDI;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  cb_adf *bare;
  multi_learner *base;
  bool check_baseline_enabled;
  size_t problem_multiplier;
  option_group_definition new_options;
  string type_string;
  bool cb_adf_option;
  free_ptr<CB_ADF::cb_adf> ld;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff4c8;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffff4d0;
  string *in_stack_fffffffffffff4d8;
  multi_learner *in_stack_fffffffffffff4e0;
  allocator *in_stack_fffffffffffff4f0;
  byte local_af2;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff518;
  allocator *paVar13;
  option_group_definition *in_stack_fffffffffffff520;
  byte local_a62;
  allocator *l_00;
  allocator local_941;
  string local_940 [39];
  allocator local_919;
  string local_918 [39];
  allocator local_8f1;
  string local_8f0 [39];
  allocator local_8c9;
  string local_8c8 [39];
  allocator local_8a1;
  string local_8a0 [39];
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [39];
  allocator local_829;
  string local_828 [39];
  allocator local_801;
  string local_800 [37];
  byte local_7db;
  byte local_7da;
  allocator local_7d9;
  string local_7d8 [37];
  byte local_7b3;
  byte local_7b2;
  allocator local_7b1;
  string local_7b0 [39];
  allocator local_789;
  string local_788 [39];
  byte local_761;
  undefined8 local_760;
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [32];
  undefined4 local_708;
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b8 [2];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [359];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  typed_option<bool> local_398 [2];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  typed_option<bool> local_208 [2];
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [79];
  allocator local_51;
  string local_50 [39];
  byte local_29;
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<CB_ADF::cb_adf>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"ips",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  l_00 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Contextual Bandit with Action Dependent Features",l_00);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4d0,
             (string *)in_stack_fffffffffffff4c8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"cb_adf",&local_229);
  VW::config::make_option<bool>(in_stack_fffffffffffff4d8,(bool *)in_stack_fffffffffffff4d0);
  VW::config::typed_option<bool>::keep(local_208,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_250,"Do Contextual Bandit learning with multiline action dependent features.",
             &local_251);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,(string *)in_stack_fffffffffffff4c8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,
             (typed_option<bool> *)in_stack_fffffffffffff4c8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff520,(typed_option<bool> *)in_stack_fffffffffffff518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"rank_all",&local_3b9);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393226);
  VW::config::make_option<bool>(in_stack_fffffffffffff4d8,(bool *)in_stack_fffffffffffff4d0);
  VW::config::typed_option<bool>::keep(local_398,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"Return actions sorted by score order",&local_3e1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,(string *)in_stack_fffffffffffff4c8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,
             (typed_option<bool> *)in_stack_fffffffffffff4c8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff520,(typed_option<bool> *)in_stack_fffffffffffff518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"no_predict",&local_549);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x39332b);
  VW::config::make_option<bool>(in_stack_fffffffffffff4d8,(bool *)in_stack_fffffffffffff4d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"Do not do a prediction when training",&local_571);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,(string *)in_stack_fffffffffffff4c8);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff4d0,
             (typed_option<bool> *)in_stack_fffffffffffff4c8);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff520,(typed_option<bool> *)in_stack_fffffffffffff518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"cb_type",&local_6d9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff4d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4d0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_6b8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_700,"contextual bandit method to use in {ips,dm,dr, mtr}",&local_701);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff4d0,(string *)in_stack_fffffffffffff4c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffff4c8 >> 0x20);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_a0);
  uVar9 = local_28._24_8_;
  if ((local_29 & 1) == 0) {
    local_8 = (AllReduce *)0x0;
    goto LAB_003948e7;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"cb_type",&local_729);
  bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_728);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  uVar9 = local_28._24_8_;
  if (((bVar10 ^ 0xff) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_750,"cb_type",&local_751);
    (**(code **)(*(long *)uVar9 + 0x28))(uVar9,local_750,local_50);
    std::__cxx11::string::~string(local_750);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_a0);
  }
  uVar9 = local_28._16_8_;
  pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                      ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393c21);
  pcVar12->all = (vw *)uVar9;
  local_760 = 1;
  local_761 = 0;
  iVar11 = std::__cxx11::string::compare((char *)local_50);
  if (iVar11 == 0) {
    pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393c66);
    (pcVar12->gen_cs).cb_type = 0;
    local_760 = 2;
    local_761 = 1;
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)local_50);
    if (iVar11 == 0) {
      pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                          ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393cad);
      (pcVar12->gen_cs).cb_type = 2;
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)local_50);
      if (iVar11 == 0) {
        pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393ce0);
        (pcVar12->gen_cs).cb_type = 3;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)local_50);
        if (iVar11 == 0) {
          pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393d13);
          (pcVar12->gen_cs).cb_type = 1;
        }
        else {
          this = std::operator<<((ostream *)(local_28._16_8_ + 0xe0),
                                 "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\'}; resetting to ips."
                                );
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                              ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393d65);
          (pcVar12->gen_cs).cb_type = 2;
        }
      }
    }
  }
  uVar9 = local_28._24_8_;
  *(code **)(local_28._16_8_ + 0x3430) = ACTION_SCORE::delete_action_scores;
  std::allocator<char>::allocator();
  local_7b2 = 0;
  local_7b3 = 0;
  local_7da = 0;
  local_7db = 0;
  std::__cxx11::string::string(local_788,"csoaa_ldf",&local_789);
  bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_788);
  uVar9 = local_28._24_8_;
  if ((bVar10 & 1) == 0) {
    std::allocator<char>::allocator();
    local_7b2 = 1;
    std::__cxx11::string::string(local_7b0,"wap_ldf",&local_7b1);
    local_7b3 = 1;
    bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_7b0);
    local_a62 = 1;
    if ((bVar10 & 1) != 0) goto LAB_00393eae;
  }
  else {
LAB_00393eae:
    pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)0x393ebb);
    uVar9 = local_28._24_8_;
    local_a62 = 1;
    if ((pcVar12->rank_all & 1U) == 0) {
      std::allocator<char>::allocator();
      local_7da = 1;
      std::__cxx11::string::string(local_7d8,"csoaa_rank",&local_7d9);
      local_7db = 1;
      local_a62 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_7d8);
      local_a62 = local_a62 ^ 0xff;
    }
  }
  if ((local_7db & 1) != 0) {
    std::__cxx11::string::~string(local_7d8);
  }
  if ((local_7da & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
  }
  if ((local_7b3 & 1) != 0) {
    std::__cxx11::string::~string(local_7b0);
  }
  if ((local_7b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  }
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)&local_789);
  uVar9 = local_28._24_8_;
  if ((local_a62 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_800,"csoaa_ldf",&local_801);
    bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_800);
    std::__cxx11::string::~string(local_800);
    std::allocator<char>::~allocator((allocator<char> *)&local_801);
    uVar9 = local_28._24_8_;
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_828,"csoaa_ldf",&local_829);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_850,"multiline",&local_851);
      (**(code **)(*(long *)uVar9 + 0x28))(uVar9,local_828,local_850);
      std::__cxx11::string::~string(local_850);
      std::allocator<char>::~allocator((allocator<char> *)&local_851);
      std::__cxx11::string::~string(local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_829);
    }
    uVar9 = local_28._24_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_878,"csoaa_rank",&local_879);
    bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_878);
    std::__cxx11::string::~string(local_878);
    std::allocator<char>::~allocator((allocator<char> *)&local_879);
    uVar9 = local_28._24_8_;
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8a0,"csoaa_rank",&local_8a1);
      paVar13 = &local_8c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c8,"",paVar13);
      (**(code **)(*(long *)uVar9 + 0x28))(uVar9,local_8a0,local_8c8);
      std::__cxx11::string::~string(local_8c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
      std::__cxx11::string::~string(local_8a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
    }
  }
  uVar9 = local_28._24_8_;
  paVar13 = &local_8f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f0,"baseline",paVar13);
  bVar10 = (**(code **)(*(long *)uVar9 + 8))(uVar9,local_8f0);
  local_af2 = 0;
  if ((bVar10 & 1) != 0) {
    local_af2 = local_761;
  }
  std::__cxx11::string::~string(local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
  if ((local_af2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_918,"check_enabled",&local_919);
    in_stack_fffffffffffff4f0 = &local_941;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_940,"",in_stack_fffffffffffff4f0);
    (**(code **)(*(long *)local_28._24_8_ + 0x28))(local_28._24_8_,local_918,local_940);
    std::__cxx11::string::~string(local_940);
    std::allocator<char>::~allocator((allocator<char> *)&local_941);
    std::__cxx11::string::~string(local_918);
    std::allocator<char>::~allocator((allocator<char> *)&local_919);
  }
  base_00 = setup_base((options_i *)in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  in_stack_fffffffffffff4e0 = LEARNER::as_multiline<char,char>((learner<char,_char> *)l_00);
  ppVar1 = *(parser **)(local_28._16_8_ + 8);
  (ppVar1->lp).label_size = DAT_00476d18;
  puVar8 = PTR_test_label_00476d10;
  puVar7 = PTR_weight_00476d00;
  puVar6 = PTR_delete_label_00476cf8;
  puVar5 = PTR_read_cached_label_00476cf0;
  puVar4 = PTR_cache_label_00476ce8;
  puVar3 = PTR_parse_label_00476ce0;
  puVar2 = CB::cb_label;
  (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_00476d08;
  (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar8;
  (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar6;
  (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar7;
  (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar4;
  (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar5;
  (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar2;
  (ppVar1->lp).parse_label =
       (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar3;
  *(label_type_t *)(local_28._16_8_ + 0x3650) = cb;
  in_stack_fffffffffffff4d0 = (vw *)local_28;
  pcVar12 = std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::get
                      ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)in_stack_fffffffffffff4d0);
  this_00 = LEARNER::
            init_learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                      ((free_ptr<CB_ADF::cb_adf> *)in_stack_fffffffffffff4f0,
                       (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)base_00
                       ,(_func_void_cb_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                         *)in_stack_fffffffffffff4e0,
                       (_func_void_cb_adf_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                        *)in_stack_fffffffffffff4d8,(size_t)in_stack_fffffffffffff4d0,pred_type);
  LEARNER::learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
  set_finish_example(this_00,CB_ADF::finish_multiline_example);
  (pcVar12->gen_cs).scorer = *(single_learner **)(local_28._16_8_ + 0x30);
  LEARNER::learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
            ((learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
             in_stack_fffffffffffff4f0,(_func_void_cb_adf_ptr *)base_00);
  LEARNER::learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_>::
  set_save_load(this_00,CB_ADF::save_load);
  local_8 = (AllReduce *)
            LEARNER::make_base<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>
                      (this_00);
LAB_003948e7:
  local_708 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)> *)in_stack_fffffffffffff4e0);
  return (base_learner *)local_8;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "ips";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr, mtr}"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm'}; resetting to ips." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}